

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBJMeshFileLoader.cpp
# Opt level: O1

IAnimatedMesh * __thiscall
irr::scene::COBJMeshFileLoader::createMesh(COBJMeshFileLoader *this,IReadFile *file)

{
  pointer *ppSVar1;
  int *piVar2;
  char cVar3;
  byte bVar4;
  int iVar5;
  undefined8 uVar6;
  SMeshBuffer *pSVar7;
  iterator __position;
  iterator iVar8;
  char cVar9;
  char cVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  undefined4 extraout_var;
  SObjMtl *pSVar14;
  undefined4 extraout_var_00;
  COBJMeshFileLoader *inBuf;
  long *plVar15;
  long lVar16;
  iterator iVar17;
  vector2d<float> this_00;
  SAnimatedMesh *this_01;
  ulong uVar18;
  uint uVar19;
  array<irr::core::vector2d<float>_> *paVar20;
  array<irr::core::vector2d<float>_> *paVar21;
  COBJMeshFileLoader *bufEnd;
  ulong uVar22;
  u32 vbsize;
  char *pcVar23;
  array<irr::core::vector2d<float>_> *paVar24;
  u32 vtsize;
  uint uVar25;
  u32 vnsize;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 uVar29;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 uVar30;
  double __x;
  undefined4 extraout_XMM0_Db_05;
  SObjMtl *currMtl;
  int vertLocation;
  s32 Idx [3];
  array<int> faceCorners;
  array<irr::core::vector3d<float>_> normalsBuffer;
  array<irr::core::vector3d<float>_> vertexBuffer;
  stringc wordBuffer;
  path fullName;
  array<irr::core::vector2d<float>_> textureCoordBuffer;
  stringc mtlName;
  stringc grpName;
  stringc TAG_OFF;
  c8 name [512];
  SObjMtl *local_3d8;
  int local_3cc;
  uint local_3c8;
  undefined8 local_3c4;
  int local_3bc;
  key_type local_3b8;
  COBJMeshFileLoader *local_390;
  undefined1 local_388 [8];
  int *piStack_380;
  _Base_ptr local_378;
  bool local_370;
  COBJMeshFileLoader *local_360;
  undefined1 local_358 [32];
  undefined1 local_338 [40];
  COBJMeshFileLoader *local_310;
  pointer local_308;
  SMeshBuffer *local_300;
  undefined1 local_2f8 [32];
  vector2d<float> *local_2d8;
  undefined8 local_2d0;
  vector2d<float> local_2c8 [2];
  array<irr::core::vector2d<float>_> local_2b8;
  undefined1 local_298 [16];
  vector2d<float> local_288 [2];
  undefined1 local_278 [32];
  array<irr::core::vector2d<float>_> local_258;
  undefined1 local_238 [8];
  float local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228 [31];
  
  if (file != (IReadFile *)0x0) {
    iVar12 = (*file->_vptr_IReadFile[2])(file);
    lVar16 = CONCAT44(extraout_var,iVar12);
    if (lVar16 != 0) {
      local_338._0_8_ = (pointer)0x0;
      local_338._8_8_ = (vector3d<float> *)0x0;
      local_338._16_8_ = (vector3d<float> *)0x0;
      local_338[0x18] = '\x01';
      ::std::vector<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>::
      reserve((vector<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_> *)
              local_338,1000);
      local_358._16_8_ = (vector3d<float> *)0x0;
      local_358._0_8_ = (SMeshBuffer *)0x0;
      local_358._8_8_ = (vector3d<float> *)0x0;
      local_358[0x18] = '\x01';
      ::std::vector<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>::
      reserve((vector<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_> *)
              local_358,1000);
      local_2b8.m_data.
      super__Vector_base<irr::core::vector2d<float>,_std::allocator<irr::core::vector2d<float>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2b8.m_data.
      super__Vector_base<irr::core::vector2d<float>,_std::allocator<irr::core::vector2d<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2b8.m_data.
      super__Vector_base<irr::core::vector2d<float>,_std::allocator<irr::core::vector2d<float>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2b8.is_sorted = true;
      ::std::vector<irr::core::vector2d<float>,_std::allocator<irr::core::vector2d<float>_>_>::
      reserve(&local_2b8.m_data,1000);
      pSVar14 = (SObjMtl *)operator_new(0x80);
      SObjMtl::SObjMtl(pSVar14);
      local_338._32_8_ = &(this->super_IMeshLoader).field_0x10;
      local_3d8 = pSVar14;
      core::array<irr::scene::COBJMeshFileLoader::SObjMtl_*>::push_back
                ((array<irr::scene::COBJMeshFileLoader::SObjMtl_*> *)local_338._32_8_,&local_3d8);
      iVar12 = (*file->_vptr_IReadFile[4])(file);
      local_2d8 = local_2c8;
      local_2d0 = 0;
      local_2c8[0].X._0_1_ = 0;
      if (&local_2d8 != (vector2d<float> **)CONCAT44(extraout_var_00,iVar12)) {
        ::std::__cxx11::string::_M_assign((string *)&local_2d8);
      }
      inBuf = (COBJMeshFileLoader *)operator_new__(lVar16 + 1U);
      memset(inBuf,0,lVar16 + 1U);
      (**file->_vptr_IReadFile)(file,inBuf,lVar16);
      bufEnd = (COBJMeshFileLoader *)((long)&(inBuf->super_IMeshLoader)._vptr_IMeshLoader + lVar16);
      local_278._0_8_ = local_278 + 0x10;
      local_278._8_8_ = (pointer)0x0;
      local_278[0x10] = '\0';
      local_298._0_8_ = local_288;
      local_298._8_8_ = (pointer)0x0;
      local_288[0].X._0_1_ = 0;
      plVar15 = (long *)(**(code **)(**(long **)&(this->super_IMeshLoader).field_0x8 + 0xd8))();
      cVar9 = (**(code **)(*plVar15 + 0x98))(plVar15,"OBJ_IgnoreGroups",0);
      plVar15 = (long *)(**(code **)(**(long **)&(this->super_IMeshLoader).field_0x8 + 0xd8))();
      cVar10 = (**(code **)(*plVar15 + 0x98))(plVar15,"OBJ_IgnoreMaterialFiles",0);
      local_378 = (_Base_ptr)0x0;
      local_388 = (undefined1  [8])0x0;
      piStack_380 = (int *)0x0;
      local_370 = true;
      core::array<int>::reallocate((array<int> *)local_388,0x20,true);
      local_258.m_data.
      super__Vector_base<irr::core::vector2d<float>,_std::allocator<irr::core::vector2d<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)&local_258.m_data.
                     super__Vector_base<irr::core::vector2d<float>,_std::allocator<irr::core::vector2d<float>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_258.m_data.
      super__Vector_base<irr::core::vector2d<float>,_std::allocator<irr::core::vector2d<float>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_258.m_data.
      super__Vector_base<irr::core::vector2d<float>,_std::allocator<irr::core::vector2d<float>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      pcVar23 = "off";
      paVar24 = &local_258;
      core::string<char>::operator=((string<char> *)paVar24,"off");
      bVar11 = false;
      local_3c8 = 0;
      local_390 = inBuf;
      local_310 = bufEnd;
      do {
        cVar3 = *(char *)&(inBuf->super_IMeshLoader)._vptr_IMeshLoader;
        switch(cVar3) {
        case 'm':
          if (cVar10 == '\0') goto switchD_001b55c7_caseD_73;
          break;
        case 'n':
        case 'o':
        case 'p':
        case 'q':
        case 'r':
        case 't':
          break;
        case 's':
switchD_001b55c7_caseD_73:
          paVar24 = (array<irr::core::vector2d<float>_> *)this;
          inBuf = (COBJMeshFileLoader *)
                  goAndCopyNextWord(this,local_238,(c8 *)inBuf,0x200,(c8 *)bufEnd);
          break;
        case 'u':
          pcVar23 = local_238;
          inBuf = (COBJMeshFileLoader *)
                  goAndCopyNextWord(this,pcVar23,(c8 *)inBuf,0x200,(c8 *)bufEnd);
          paVar24 = (array<irr::core::vector2d<float>_> *)local_298;
LAB_001b5719:
          core::string<char>::operator=((string<char> *)paVar24,pcVar23);
LAB_001b571e:
          bVar11 = true;
          break;
        case 'v':
          cVar3 = *(char *)((long)&(inBuf->super_IMeshLoader)._vptr_IMeshLoader + 1);
          if (cVar3 == 't') {
            local_238._0_4_ = 0.0;
            local_238._4_4_ = 0.0;
            inBuf = (COBJMeshFileLoader *)
                    readUV(this,(c8 *)inBuf,(vector2d<float> *)local_238,(c8 *)bufEnd);
            paVar24 = &local_2b8;
            core::array<irr::core::vector2d<float>_>::push_back
                      (paVar24,(vector2d<float> *)local_238);
          }
          else if (cVar3 == 'n') {
            local_238._0_4_ = 0.0;
            local_238._4_4_ = 0.0;
            local_230 = 0.0;
            paVar24 = (array<irr::core::vector2d<float>_> *)this;
            inBuf = (COBJMeshFileLoader *)
                    readVec3(this,(c8 *)inBuf,(vector3df *)local_238,(c8 *)bufEnd);
            if (local_358._8_8_ == local_358._16_8_) {
              paVar24 = (array<irr::core::vector2d<float>_> *)local_358;
              ::std::vector<irr::core::vector3d<float>,std::allocator<irr::core::vector3d<float>>>::
              _M_realloc_insert<irr::core::vector3d<float>const&>
                        ((vector<irr::core::vector3d<float>,std::allocator<irr::core::vector3d<float>>>
                          *)paVar24,(iterator)local_358._8_8_,(vector3df *)local_238);
            }
            else {
              *(float *)(local_358._8_8_ + 8) = local_230;
              *(undefined1 (*) [8])local_358._8_8_ = local_238;
              local_358._8_8_ = local_358._8_8_ + 0xc;
            }
            local_358[0x18] = '\0';
          }
          else if (cVar3 == ' ') {
            local_238._0_4_ = 0.0;
            local_238._4_4_ = 0.0;
            local_230 = 0.0;
            paVar24 = (array<irr::core::vector2d<float>_> *)this;
            inBuf = (COBJMeshFileLoader *)
                    readVec3(this,(c8 *)inBuf,(vector3df *)local_238,(c8 *)bufEnd);
            if (local_338._8_8_ == local_338._16_8_) {
              paVar24 = (array<irr::core::vector2d<float>_> *)local_338;
              ::std::vector<irr::core::vector3d<float>,std::allocator<irr::core::vector3d<float>>>::
              _M_realloc_insert<irr::core::vector3d<float>const&>
                        ((vector<irr::core::vector3d<float>,std::allocator<irr::core::vector3d<float>>>
                          *)paVar24,(iterator)local_338._8_8_,(vector3df *)local_238);
            }
            else {
              *(float *)(local_338._8_8_ + 8) = local_230;
              *(undefined1 (*) [8])local_338._8_8_ = local_238;
              local_338._8_8_ = local_338._8_8_ + 0xc;
            }
            local_338[0x18] = '\0';
          }
          break;
        default:
          if (cVar3 == 'f') {
            local_3b8.Normal.Y = 0.0;
            local_3b8.Normal.Z = 0.0;
            local_3b8.Pos._0_8_ = (void *)0x0;
            local_3b8.Pos.Z = 0.0;
            local_3b8.Normal.X = 0.0;
            local_3b8.Color.color = 0xffffffff;
            local_3b8.TCoords.X = 0.0;
            local_3b8.TCoords.Y = 0.0;
            local_360 = inBuf;
            if (bVar11) {
              pcVar23 = local_298;
              pSVar14 = findMtl(this,(stringc *)pcVar23,(stringc *)local_278);
              if (pSVar14 != (SObjMtl *)0x0) {
                local_3d8 = pSVar14;
              }
              bVar11 = false;
            }
            if (local_3d8 != (SObjMtl *)0x0) {
              local_3b8.Color.color = (local_3d8->Meshbuffer->Material).DiffuseColor.color;
            }
            copyLine((stringc *)local_2f8,(COBJMeshFileLoader *)pcVar23,(c8 *)local_360,(c8 *)bufEnd
                    );
            paVar21 = (array<irr::core::vector2d<float>_> *)local_2f8._0_8_;
            uVar22 = (ulong)(uint)local_2f8._8_4_;
            paVar24 = (array<irr::core::vector2d<float>_> *)(local_2f8._0_8_ + uVar22);
            pSVar14 = (SObjMtl *)local_388;
            ::std::vector<int,_std::allocator<int>_>::resize
                      ((vector<int,_std::allocator<int>_> *)pSVar14,0);
            bVar26 = uVar22 == 0;
            paVar20 = paVar21;
            if (!bVar26) {
              bVar26 = false;
              do {
                uVar18 = (ulong)*(byte *)&(paVar21->m_data).
                                          super__Vector_base<irr::core::vector2d<float>,_std::allocator<irr::core::vector2d<float>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start;
                if ((uVar18 < 0x21) &&
                   (paVar20 = paVar21, (0x100003e00U >> (uVar18 & 0x3f) & 1) != 0)) break;
                paVar21 = (array<irr::core::vector2d<float>_> *)
                          ((long)&(paVar21->m_data).
                                  super__Vector_base<irr::core::vector2d<float>,_std::allocator<irr::core::vector2d<float>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1);
                uVar22 = uVar22 - 1;
                bVar26 = uVar22 == 0;
                paVar20 = paVar24;
              } while (!bVar26);
            }
            paVar21 = paVar20;
            uVar29 = extraout_XMM0_Da;
            uVar30 = extraout_XMM0_Db;
            if (!bVar26) {
              do {
                bVar4 = *(byte *)&(paVar20->m_data).
                                  super__Vector_base<irr::core::vector2d<float>,_std::allocator<irr::core::vector2d<float>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
                if ((4 < bVar4 - 9) && (paVar21 = paVar20, bVar4 != 0x20)) break;
                paVar20 = (array<irr::core::vector2d<float>_> *)
                          ((long)&(paVar20->m_data).
                                  super__Vector_base<irr::core::vector2d<float>,_std::allocator<irr::core::vector2d<float>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1);
                paVar21 = paVar24;
              } while (paVar20 != paVar24);
            }
            do {
              uVar6 = local_338._0_8_;
              if (*(char *)&(paVar21->m_data).
                            super__Vector_base<irr::core::vector2d<float>,_std::allocator<irr::core::vector2d<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start == '\0') {
                if (2 < (uint)((ulong)((long)piStack_380 - (long)local_388) >> 2)) {
                  bVar26 = true;
                  uVar25 = local_3c8;
                  if ((int)((ulong)((long)piStack_380 - (long)local_388) >> 2) - 3U < 0xfffffffe) {
                    iVar12 = *(int *)local_388;
                    uVar22 = 1;
                    do {
                      iVar13 = *(int *)((long)local_388 + uVar22 * 4);
                      iVar5 = *(int *)((long)local_388 + (uVar22 + 1) * 4);
                      if (((iVar5 == iVar13) || (iVar5 == iVar12)) || (iVar13 == iVar12)) {
                        uVar25 = uVar25 + 1;
                      }
                      else {
                        pSVar7 = local_3d8->Meshbuffer;
                        iVar8._M_current =
                             (pSVar7->Indices).m_data.
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_finish;
                        if (iVar8._M_current ==
                            (pSVar7->Indices).m_data.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage) {
                          local_3c4._0_2_ = (unsigned_short)iVar5;
                          ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
                          _M_realloc_insert<unsigned_short>
                                    (&(pSVar7->Indices).m_data,iVar8,(unsigned_short *)&local_3c4);
                        }
                        else {
                          *iVar8._M_current = (unsigned_short)iVar5;
                          (pSVar7->Indices).m_data.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_finish = iVar8._M_current + 1;
                        }
                        (pSVar7->Indices).is_sorted = false;
                        pSVar7 = local_3d8->Meshbuffer;
                        local_3c4._0_2_ = (unsigned_short)iVar13;
                        iVar8._M_current =
                             (pSVar7->Indices).m_data.
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_finish;
                        if (iVar8._M_current ==
                            (pSVar7->Indices).m_data.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage) {
                          ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
                          _M_realloc_insert<unsigned_short>
                                    (&(pSVar7->Indices).m_data,iVar8,(unsigned_short *)&local_3c4);
                        }
                        else {
                          *iVar8._M_current = (unsigned_short)local_3c4;
                          (pSVar7->Indices).m_data.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_finish = iVar8._M_current + 1;
                        }
                        (pSVar7->Indices).is_sorted = false;
                        pSVar7 = local_3d8->Meshbuffer;
                        local_3c4 = CONCAT62(local_3c4._2_6_,(unsigned_short)iVar12);
                        iVar8._M_current =
                             (pSVar7->Indices).m_data.
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_finish;
                        if (iVar8._M_current ==
                            (pSVar7->Indices).m_data.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage) {
                          ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
                          _M_realloc_insert<unsigned_short>
                                    (&(pSVar7->Indices).m_data,iVar8,(unsigned_short *)&local_3c4);
                        }
                        else {
                          *iVar8._M_current = (unsigned_short)iVar12;
                          (pSVar7->Indices).m_data.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_finish = iVar8._M_current + 1;
                        }
                        (pSVar7->Indices).is_sorted = false;
                      }
                      uVar22 = uVar22 + 1;
                      bVar26 = true;
                    } while (uVar22 < (int)((ulong)((long)piStack_380 - (long)local_388) >> 2) - 1);
                  }
                  goto LAB_001b5ba0;
                }
                os::Printer::log((double)CONCAT44(uVar30,uVar29));
                operator_delete__(local_390);
                cleanUp(this);
                break;
              }
              local_3bc = -1;
              local_3c4 = 0xffffffffffffffff;
              uVar22 = 0;
              while( true ) {
                uVar25 = (uint)uVar22;
                uVar18 = (ulong)*(byte *)((long)&(paVar21->m_data).
                                                 super__Vector_base<irr::core::vector2d<float>,_std::allocator<irr::core::vector2d<float>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start + uVar22)
                ;
                if (((uVar18 < 0x21) && ((0x100003e01U >> (uVar18 & 0x3f) & 1) != 0)) ||
                   ((array<irr::core::vector2d<float>_> *)
                    ((long)&(paVar21->m_data).
                            super__Vector_base<irr::core::vector2d<float>,_std::allocator<irr::core::vector2d<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + uVar22) == paVar24)) break;
                uVar22 = (ulong)(uVar25 + 1);
              }
              uVar19 = 0x1ff;
              if (uVar25 < 0x1ff) {
                uVar19 = uVar25;
              }
              if (uVar25 != 0) {
                if (0x1fe < uVar22) {
                  uVar22 = 0x1ff;
                }
                uVar18 = 0;
                do {
                  local_238[uVar18] =
                       *(undefined1 *)
                        ((long)&(paVar21->m_data).
                                super__Vector_base<irr::core::vector2d<float>,_std::allocator<irr::core::vector2d<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar18);
                  uVar18 = uVar18 + 1;
                } while (uVar22 != uVar18);
              }
              local_238[uVar19] = 0;
              iVar12 = (int)((ulong)(local_338._8_8_ - local_338._0_8_) >> 2);
              vbsize = iVar12 * -0x55555555;
              local_308 = local_2b8.m_data.
                          super__Vector_base<irr::core::vector2d<float>,_std::allocator<irr::core::vector2d<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              local_300 = (SMeshBuffer *)local_358._0_8_;
              iVar13 = (int)((ulong)(local_358._8_8_ - local_358._0_8_) >> 2);
              vnsize = iVar13 * -0x55555555;
              vtsize = (u32)((ulong)((long)local_2b8.m_data.
                                           super__Vector_base<irr::core::vector2d<float>,_std::allocator<irr::core::vector2d<float>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_2b8.m_data.
                                          super__Vector_base<irr::core::vector2d<float>,_std::allocator<irr::core::vector2d<float>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 3);
              retrieveVertexIndices
                        ((COBJMeshFileLoader *)pSVar14,local_238,(s32 *)&local_3c4,
                         local_238 + (ulong)uVar19 + 1,vbsize,vtsize,vnsize);
              bVar28 = (int)local_3c4 < 0;
              bVar26 = SBORROW4((int)local_3c4,vbsize) == (int)local_3c4 + iVar12 * 0x55555555 < 0;
              if (bVar26 || bVar28) {
                os::Printer::log((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
                operator_delete__(local_390);
                pSVar14 = (SObjMtl *)this;
                cleanUp(this);
                uVar29 = extraout_XMM0_Da_01;
                uVar30 = extraout_XMM0_Db_01;
              }
              else {
                local_3b8.Pos.Z = ((float *)(uVar6 + 8))[(local_3c4 & 0xffffffff) * 3];
                local_3b8.Pos._0_8_ = *(undefined8 *)(uVar6 + (local_3c4 & 0xffffffff) * 0xc);
                local_3b8.TCoords.X = 0.0;
                local_3b8.TCoords.Y = 0.0;
                if ((-1 < (long)local_3c4._4_4_) && (local_3c4._4_4_ < (int)vtsize)) {
                  local_3b8.TCoords.X = local_308[local_3c4._4_4_].X;
                  local_3b8.TCoords.Y = local_308[local_3c4._4_4_].Y;
                }
                lVar16 = (long)local_3bc;
                if ((lVar16 < 0) ||
                   (SBORROW4(local_3bc,vnsize) == local_3bc + iVar13 * 0x55555555 < 0)) {
                  local_3b8.Normal.X = 0.0;
                  local_3b8.Normal.Y = 0.0;
                  local_3b8.Normal.Z = 0.0;
                  local_3d8->RecalculateNormals = true;
                }
                else {
                  local_3b8.Normal.Z =
                       *(float *)((long)((local_300->Material).TextureLayers + -1) + 8 +
                                 lVar16 * 0xc);
                  uVar6 = *(undefined8 *)
                           ((long)((local_300->Material).TextureLayers + -1) + lVar16 * 0xc);
                  local_3b8.Normal.X = (float)uVar6;
                  local_3b8.Normal.Y = (float)((ulong)uVar6 >> 0x20);
                }
                pSVar14 = local_3d8;
                iVar17 = ::std::
                         _Rb_tree<irr::video::S3DVertex,_std::pair<const_irr::video::S3DVertex,_int>,_std::_Select1st<std::pair<const_irr::video::S3DVertex,_int>_>,_std::less<irr::video::S3DVertex>,_std::allocator<std::pair<const_irr::video::S3DVertex,_int>_>_>
                         ::find((_Rb_tree<irr::video::S3DVertex,_std::pair<const_irr::video::S3DVertex,_int>,_std::_Select1st<std::pair<const_irr::video::S3DVertex,_int>_>,_std::less<irr::video::S3DVertex>,_std::allocator<std::pair<const_irr::video::S3DVertex,_int>_>_>
                                 *)local_3d8,&local_3b8);
                if ((_Rb_tree_header *)iVar17._M_node ==
                    &(local_3d8->VertMap)._M_t._M_impl.super__Rb_tree_header) {
                  pSVar7 = local_3d8->Meshbuffer;
                  __position._M_current =
                       (pSVar7->Vertices).m_data.
                       super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  if (__position._M_current ==
                      (pSVar7->Vertices).m_data.
                      super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    ::std::vector<irr::video::S3DVertex,std::allocator<irr::video::S3DVertex>>::
                    _M_realloc_insert<irr::video::S3DVertex_const&>
                              ((vector<irr::video::S3DVertex,std::allocator<irr::video::S3DVertex>>
                                *)&pSVar7->Vertices,__position,&local_3b8);
                  }
                  else {
                    ((__position._M_current)->TCoords).Y = local_3b8.TCoords.Y;
                    ((__position._M_current)->Normal).Y = local_3b8.Normal.Y;
                    ((__position._M_current)->Normal).Z = local_3b8.Normal.Z;
                    (__position._M_current)->Color = (SColor)local_3b8.Color.color;
                    ((__position._M_current)->TCoords).X = local_3b8.TCoords.X;
                    ((__position._M_current)->Pos).X = local_3b8.Pos.X;
                    ((__position._M_current)->Pos).Y = local_3b8.Pos.Y;
                    *(ulong *)&((__position._M_current)->Pos).Z =
                         CONCAT44(local_3b8.Normal.X,local_3b8.Pos.Z);
                    ppSVar1 = &(pSVar7->Vertices).m_data.
                               super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                    *ppSVar1 = *ppSVar1 + 1;
                  }
                  (pSVar7->Vertices).is_sorted = false;
                  local_3cc = (int)((ulong)((long)(local_3d8->Meshbuffer->Vertices).m_data.
                                                  super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)(local_3d8->Meshbuffer->Vertices).m_data.
                                                 super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                                                 ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                              0x38e38e39 + -1;
                  pSVar14 = local_3d8;
                  ::std::
                  _Rb_tree<irr::video::S3DVertex,std::pair<irr::video::S3DVertex_const,int>,std::_Select1st<std::pair<irr::video::S3DVertex_const,int>>,std::less<irr::video::S3DVertex>,std::allocator<std::pair<irr::video::S3DVertex_const,int>>>
                  ::_M_emplace_unique<irr::video::S3DVertex&,int&>
                            ((_Rb_tree<irr::video::S3DVertex,std::pair<irr::video::S3DVertex_const,int>,std::_Select1st<std::pair<irr::video::S3DVertex_const,int>>,std::less<irr::video::S3DVertex>,std::allocator<std::pair<irr::video::S3DVertex_const,int>>>
                              *)local_3d8,&local_3b8,&local_3cc);
                  uVar29 = extraout_XMM0_Da_03;
                  uVar30 = extraout_XMM0_Db_03;
                }
                else {
                  local_3cc = *(int *)&iVar17._M_node[2].field_0x4;
                  uVar29 = extraout_XMM0_Da_02;
                  uVar30 = extraout_XMM0_Db_02;
                }
                if ((_Base_ptr)piStack_380 == local_378) {
                  pSVar14 = (SObjMtl *)local_388;
                  ::std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)pSVar14,(iterator)piStack_380,
                             &local_3cc);
                  uVar29 = extraout_XMM0_Da_04;
                  uVar30 = extraout_XMM0_Db_04;
                }
                else {
                  *piStack_380 = local_3cc;
                  piStack_380 = piStack_380 + 1;
                }
                local_370 = false;
                bVar27 = paVar21 == paVar24;
                paVar20 = paVar21;
                if (!bVar27) {
                  bVar27 = false;
                  do {
                    uVar22 = (ulong)*(byte *)&(paVar21->m_data).
                                              super__Vector_base<irr::core::vector2d<float>,_std::allocator<irr::core::vector2d<float>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start;
                    if ((uVar22 < 0x21) &&
                       (paVar20 = paVar21, (0x100003e00U >> (uVar22 & 0x3f) & 1) != 0)) break;
                    paVar21 = (array<irr::core::vector2d<float>_> *)
                              ((long)&(paVar21->m_data).
                                      super__Vector_base<irr::core::vector2d<float>,_std::allocator<irr::core::vector2d<float>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1);
                    bVar27 = paVar21 == paVar24;
                    paVar20 = paVar24;
                  } while (!bVar27);
                }
                paVar21 = paVar20;
                if (!bVar27) {
                  do {
                    bVar4 = *(byte *)&(paVar20->m_data).
                                      super__Vector_base<irr::core::vector2d<float>,_std::allocator<irr::core::vector2d<float>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start;
                    if ((4 < bVar4 - 9) && (paVar21 = paVar20, bVar4 != 0x20)) break;
                    paVar20 = (array<irr::core::vector2d<float>_> *)
                              ((long)&(paVar20->m_data).
                                      super__Vector_base<irr::core::vector2d<float>,_std::allocator<irr::core::vector2d<float>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1);
                    paVar21 = paVar24;
                  } while (paVar20 != paVar24);
                }
              }
            } while (!bVar26 && !bVar28);
            bVar26 = false;
            uVar25 = local_3c8;
LAB_001b5ba0:
            local_3c8 = uVar25;
            this_01 = (SAnimatedMesh *)0x0;
            paVar24 = (array<irr::core::vector2d<float>_> *)local_2f8._0_8_;
            if ((array<irr::core::vector2d<float>_> *)local_2f8._0_8_ !=
                (array<irr::core::vector2d<float>_> *)(local_2f8 + 0x10)) {
              operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ + 1);
            }
            bufEnd = local_310;
            inBuf = local_360;
            if (!bVar26) goto LAB_001b60ae;
          }
          else if (cVar3 == 'g') {
            paVar24 = (array<irr::core::vector2d<float>_> *)this;
            inBuf = (COBJMeshFileLoader *)
                    goAndCopyNextWord(this,local_238,(c8 *)inBuf,0x200,(c8 *)bufEnd);
            if (cVar9 == '\0') {
              pcVar23 = local_238;
              if (local_238[0] == '\0') {
                pcVar23 = "default";
              }
              paVar24 = (array<irr::core::vector2d<float>_> *)local_278;
              goto LAB_001b5719;
            }
            goto LAB_001b571e;
          }
        }
        pcVar23 = (char *)inBuf;
        inBuf = (COBJMeshFileLoader *)
                goNextLine((COBJMeshFileLoader *)paVar24,(c8 *)inBuf,(c8 *)bufEnd);
        uVar6 = local_338._32_8_;
      } while (inBuf != bufEnd);
      if (local_3c8 != 0) {
        core::string<char>::string((string<char> *)local_238,local_3c8);
        ::std::__cxx11::string::append((char *)local_238,0x22ca81);
        local_3b8.Pos.Z = 0.0;
        local_3b8.Normal.X = 0.0;
        local_3b8.Normal.Y = (float)((uint)local_3b8.Normal.Y & 0xffffff00);
        local_3b8.Pos._0_8_ = (void *)((long)&local_3b8 + 0x10U);
        ::std::__cxx11::string::_M_assign((string *)&local_3b8);
        __x = (double)::std::__cxx11::string::_M_append((char *)local_238,local_3b8.Pos._0_8_);
        if ((void *)local_3b8.Pos._0_8_ != (void *)((long)&local_3b8 + 0x10U)) {
          operator_delete((void *)local_3b8.Pos._0_8_,
                          CONCAT44(local_3b8.Normal.Z,local_3b8.Normal.Y) + 1);
          __x = (double)CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05);
        }
        os::Printer::log((Printer *)local_238,__x);
        if (local_238 != (undefined1  [8])local_228) {
          operator_delete((void *)local_238,local_228[0]._M_allocated_capacity + 1);
        }
      }
      this_00 = (vector2d<float>)operator_new(0x58);
      *(undefined8 *)((long)this_00 + 0x48) = 0;
      *(undefined4 *)((long)this_00 + 0x50) = 1;
      *(undefined ***)this_00 = &PTR_getMeshBufferCount_00262e90;
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)((long)this_00 + 0x40))->_M_allocated_capacity = (size_type)&PTR__SMesh_00262f00;
      pcVar23 = (char *)((long)this_00 + 8);
      pcVar23[0] = '\0';
      pcVar23[1] = '\0';
      pcVar23[2] = '\0';
      pcVar23[3] = '\0';
      pcVar23[4] = '\0';
      pcVar23[5] = '\0';
      pcVar23[6] = '\0';
      pcVar23[7] = '\0';
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)((long)this_00 + 0x10))->_M_allocated_capacity = 0;
      *(undefined8 *)((long)this_00 + 0x18) = 0;
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)((long)this_00 + 0x20))->_M_local_buf[0] = '\x01';
      (((aabbox3d<float> *)((long)this_00 + 0x28))->MinEdge).X = -1.0;
      (((aabbox3d<float> *)((long)this_00 + 0x28))->MinEdge).Y = -1.0;
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)((long)this_00 + 0x30))->_M_allocated_capacity = 0x3f800000bf800000;
      *(undefined8 *)((long)this_00 + 0x38) = 0x3f8000003f800000;
      lVar16 = *(long *)&(this->super_IMeshLoader).field_0x10;
      if ((int)((ulong)(*(long *)&(this->super_IMeshLoader).field_0x18 - lVar16) >> 3) != 0) {
        uVar22 = 0;
        do {
          iVar12 = (**(code **)(**(long **)(*(long *)(lVar16 + uVar22 * 8) + 0x30) + 0x48))();
          if (iVar12 != 0) {
            (**(code **)(**(long **)(*(long *)(*(long *)uVar6 + uVar22 * 8) + 0x30) + 0x60))();
            if (*(char *)(*(long *)(*(long *)uVar6 + uVar22 * 8) + 0x7d) == '\x01') {
              plVar15 = (long *)(**(code **)(**(long **)&(this->super_IMeshLoader).field_0x8 + 0xb8)
                                )();
              (**(code **)(*plVar15 + 8))
                        (plVar15,*(undefined8 *)
                                  (*(long *)(*(long *)&(this->super_IMeshLoader).field_0x10 +
                                            uVar22 * 8) + 0x30),0,0);
            }
            local_238 = *(undefined1 (*) [8])(*(long *)(*(long *)uVar6 + uVar22 * 8) + 0x30);
            if ((vector2d<float>)local_238 != (vector2d<float>)0x0) {
              piVar2 = (int *)((long)((long)local_238 + 0x10) +
                              *(long *)(*(size_type *)local_238 - 0x18));
              *piVar2 = *piVar2 + 1;
              core::array<irr::scene::IMeshBuffer_*>::push_back
                        ((array<irr::scene::IMeshBuffer_*> *)((long)this_00 + 8),
                         (IMeshBuffer **)local_238);
            }
          }
          uVar22 = uVar22 + 1;
          lVar16 = *(long *)&(this->super_IMeshLoader).field_0x10;
        } while (uVar22 < ((ulong)(*(long *)&(this->super_IMeshLoader).field_0x18 - lVar16) >> 3 &
                          0xffffffff));
      }
      iVar12 = (*(code *)**(undefined8 **)this_00)(this_00);
      if (iVar12 == 0) {
        this_01 = (SAnimatedMesh *)0x0;
      }
      else {
        SMesh::recalculateBoundingBox((SMesh *)this_00);
        this_01 = (SAnimatedMesh *)operator_new(0x60);
        SAnimatedMesh::SAnimatedMesh(this_01,(IMesh *)0x0,EAMT_UNKNOWN);
        this_01->Type = EAMT_OBJ;
        *(int *)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)this_00 + 0x10))->_M_local_buf + *(long *)(*(size_type *)this_00 - 0x18)
                ) = *(int *)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)((long)this_00 + 0x10))->_M_local_buf +
                            *(long *)(*(size_type *)this_00 - 0x18)) + 1;
        local_238 = (undefined1  [8])this_00;
        core::array<irr::scene::IMesh_*>::push_back(&this_01->Meshes,(IMesh **)local_238);
        SAnimatedMesh::recalculateBoundingBox(this_01);
      }
      operator_delete__(local_390);
      cleanUp(this);
      lVar16 = *(long *)(*(size_type *)this_00 - 0x18);
      piVar2 = (int *)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)((long)this_00 + 0x10))->_M_local_buf + lVar16);
      *piVar2 = *piVar2 + -1;
      if (*piVar2 == 0) {
        plVar15 = (long *)((long)this_00 + lVar16);
        (**(code **)(*plVar15 + 8))(plVar15);
      }
LAB_001b60ae:
      if (local_258.m_data.
          super__Vector_base<irr::core::vector2d<float>,_std::allocator<irr::core::vector2d<float>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&local_258.m_data.
                    super__Vector_base<irr::core::vector2d<float>,_std::allocator<irr::core::vector2d<float>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(local_258.m_data.
                        super__Vector_base<irr::core::vector2d<float>,_std::allocator<irr::core::vector2d<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        CONCAT71(local_258.m_data.
                                 super__Vector_base<irr::core::vector2d<float>,_std::allocator<irr::core::vector2d<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                 local_258.m_data.
                                 super__Vector_base<irr::core::vector2d<float>,_std::allocator<irr::core::vector2d<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) + 1);
      }
      if (local_388 != (undefined1  [8])0x0) {
        operator_delete((void *)local_388,(long)local_378 - (long)local_388);
      }
      if ((vector2d<float> *)local_298._0_8_ != local_288) {
        operator_delete((void *)local_298._0_8_,
                        CONCAT71(local_288[0]._1_7_,local_288[0].X._0_1_) + 1);
      }
      if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
        operator_delete((void *)local_278._0_8_,CONCAT71(local_278._17_7_,local_278[0x10]) + 1);
      }
      if (local_2d8 != local_2c8) {
        operator_delete(local_2d8,CONCAT71(local_2c8[0]._1_7_,local_2c8[0].X._0_1_) + 1);
      }
      if (local_2b8.m_data.
          super__Vector_base<irr::core::vector2d<float>,_std::allocator<irr::core::vector2d<float>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2b8.m_data.
                        super__Vector_base<irr::core::vector2d<float>,_std::allocator<irr::core::vector2d<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_2b8.m_data.
                              super__Vector_base<irr::core::vector2d<float>,_std::allocator<irr::core::vector2d<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2b8.m_data.
                              super__Vector_base<irr::core::vector2d<float>,_std::allocator<irr::core::vector2d<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((SMeshBuffer *)local_358._0_8_ != (SMeshBuffer *)0x0) {
        operator_delete((void *)local_358._0_8_,local_358._16_8_ - local_358._0_8_);
      }
      if ((pointer)local_338._0_8_ == (pointer)0x0) {
        return (IAnimatedMesh *)this_01;
      }
      operator_delete((void *)local_338._0_8_,local_338._16_8_ - local_338._0_8_);
      return (IAnimatedMesh *)this_01;
    }
  }
  return (IAnimatedMesh *)(SAnimatedMesh *)0x0;
}

Assistant:

IAnimatedMesh *COBJMeshFileLoader::createMesh(io::IReadFile *file)
{
	if (!file)
		return 0;

	const long filesize = file->getSize();
	if (!filesize)
		return 0;

	const u32 WORD_BUFFER_LENGTH = 512;

	core::array<core::vector3df> vertexBuffer(1000);
	core::array<core::vector3df> normalsBuffer(1000);
	core::array<core::vector2df> textureCoordBuffer(1000);

	SObjMtl *currMtl = new SObjMtl();
	Materials.push_back(currMtl);
	u32 smoothingGroup = 0;

	const io::path fullName = file->getFileName();

	c8 *buf = new c8[filesize + 1]; // plus null-terminator
	memset(buf, 0, filesize + 1);
	file->read((void *)buf, filesize);
	const c8 *const bufEnd = buf + filesize;

	// Process obj information
	const c8 *bufPtr = buf;
	core::stringc grpName, mtlName;
	bool mtlChanged = false;
	bool useGroups = !SceneManager->getParameters()->getAttributeAsBool(OBJ_LOADER_IGNORE_GROUPS);
	bool useMaterials = !SceneManager->getParameters()->getAttributeAsBool(OBJ_LOADER_IGNORE_MATERIAL_FILES);
	[[maybe_unused]] irr::u32 lineNr = 1; // only counts non-empty lines, still useful in debugging to locate errors
	core::array<int> faceCorners;
	faceCorners.reallocate(32); // should be large enough
	const core::stringc TAG_OFF = "off";
	irr::u32 degeneratedFaces = 0;

	while (bufPtr != bufEnd) {
		switch (bufPtr[0]) {
		case 'm': // mtllib (material)
		{
			if (useMaterials) {
				c8 name[WORD_BUFFER_LENGTH];
				bufPtr = goAndCopyNextWord(name, bufPtr, WORD_BUFFER_LENGTH, bufEnd);
#ifdef _IRR_DEBUG_OBJ_LOADER_
				os::Printer::log("Ignoring material file", name);
#endif
			}
		} break;

		case 'v': // v, vn, vt
			switch (bufPtr[1]) {
			case ' ': // vertex
			{
				core::vector3df vec;
				bufPtr = readVec3(bufPtr, vec, bufEnd);
				vertexBuffer.push_back(vec);
			} break;

			case 'n': // normal
			{
				core::vector3df vec;
				bufPtr = readVec3(bufPtr, vec, bufEnd);
				normalsBuffer.push_back(vec);
			} break;

			case 't': // texcoord
			{
				core::vector2df vec;
				bufPtr = readUV(bufPtr, vec, bufEnd);
				textureCoordBuffer.push_back(vec);
			} break;
			}
			break;

		case 'g': // group name
		{
			c8 grp[WORD_BUFFER_LENGTH];
			bufPtr = goAndCopyNextWord(grp, bufPtr, WORD_BUFFER_LENGTH, bufEnd);
#ifdef _IRR_DEBUG_OBJ_LOADER_
			os::Printer::log("Loaded group start", grp, ELL_DEBUG);
#endif
			if (useGroups) {
				if (0 != grp[0])
					grpName = grp;
				else
					grpName = "default";
			}
			mtlChanged = true;
		} break;

		case 's': // smoothing can be a group or off (equiv. to 0)
		{
			c8 smooth[WORD_BUFFER_LENGTH];
			bufPtr = goAndCopyNextWord(smooth, bufPtr, WORD_BUFFER_LENGTH, bufEnd);
#ifdef _IRR_DEBUG_OBJ_LOADER_
			os::Printer::log("Loaded smoothing group start", smooth, ELL_DEBUG);
#endif
			if (TAG_OFF == smooth)
				smoothingGroup = 0;
			else
				smoothingGroup = core::strtoul10(smooth);

			(void)smoothingGroup; // disable unused variable warnings
		} break;

		case 'u': // usemtl
			// get name of material
			{
				c8 matName[WORD_BUFFER_LENGTH];
				bufPtr = goAndCopyNextWord(matName, bufPtr, WORD_BUFFER_LENGTH, bufEnd);
#ifdef _IRR_DEBUG_OBJ_LOADER_
				os::Printer::log("Loaded material start", matName, ELL_DEBUG);
#endif
				mtlName = matName;
				mtlChanged = true;
			}
			break;

		case 'f': // face
		{
			c8 vertexWord[WORD_BUFFER_LENGTH]; // for retrieving vertex data
			video::S3DVertex v;
			// Assign vertex color from currently active material's diffuse color
			if (mtlChanged) {
				// retrieve the material
				SObjMtl *useMtl = findMtl(mtlName, grpName);
				// only change material if we found it
				if (useMtl)
					currMtl = useMtl;
				mtlChanged = false;
			}
			if (currMtl)
				v.Color = currMtl->Meshbuffer->Material.DiffuseColor;

			// get all vertices data in this face (current line of obj file)
			const core::stringc wordBuffer = copyLine(bufPtr, bufEnd);
			const c8 *linePtr = wordBuffer.c_str();
			const c8 *const endPtr = linePtr + wordBuffer.size();

			faceCorners.set_used(0); // fast clear

			// read in all vertices
			linePtr = goNextWord(linePtr, endPtr);
			while (0 != linePtr[0]) {
				// Array to communicate with retrieveVertexIndices()
				// sends the buffer sizes and gets the actual indices
				// if index not set returns -1
				s32 Idx[3];
				Idx[0] = Idx[1] = Idx[2] = -1;

				// read in next vertex's data
				u32 wlength = copyWord(vertexWord, linePtr, WORD_BUFFER_LENGTH, endPtr);
				// this function will also convert obj's 1-based index to c++'s 0-based index
				retrieveVertexIndices(vertexWord, Idx, vertexWord + wlength + 1, vertexBuffer.size(), textureCoordBuffer.size(), normalsBuffer.size());
				if (Idx[0] >= 0 && Idx[0] < (irr::s32)vertexBuffer.size())
					v.Pos = vertexBuffer[Idx[0]];
				else {
					os::Printer::log("Invalid vertex index in this line", wordBuffer.c_str(), ELL_ERROR);
					delete[] buf;
					cleanUp();
					return 0;
				}
				if (Idx[1] >= 0 && Idx[1] < (irr::s32)textureCoordBuffer.size())
					v.TCoords = textureCoordBuffer[Idx[1]];
				else
					v.TCoords.set(0.0f, 0.0f);
				if (Idx[2] >= 0 && Idx[2] < (irr::s32)normalsBuffer.size())
					v.Normal = normalsBuffer[Idx[2]];
				else {
					v.Normal.set(0.0f, 0.0f, 0.0f);
					currMtl->RecalculateNormals = true;
				}

				int vertLocation;
				auto n = currMtl->VertMap.find(v);
				if (n != currMtl->VertMap.end()) {
					vertLocation = n->second;
				} else {
					currMtl->Meshbuffer->Vertices.push_back(v);
					vertLocation = currMtl->Meshbuffer->Vertices.size() - 1;
					currMtl->VertMap.emplace(v, vertLocation);
				}

				faceCorners.push_back(vertLocation);

				// go to next vertex
				linePtr = goNextWord(linePtr, endPtr);
			}

			if (faceCorners.size() < 3) {
				os::Printer::log("Too few vertices in this line", wordBuffer.c_str(), ELL_ERROR);
				delete[] buf;
				cleanUp();
				return 0;
			}

			// triangulate the face
			const int c = faceCorners[0];
			for (u32 i = 1; i < faceCorners.size() - 1; ++i) {
				// Add a triangle
				const int a = faceCorners[i + 1];
				const int b = faceCorners[i];
				if (a != b && a != c && b != c) { // ignore degenerated faces. We can get them when we merge vertices above in the VertMap.
					currMtl->Meshbuffer->Indices.push_back(a);
					currMtl->Meshbuffer->Indices.push_back(b);
					currMtl->Meshbuffer->Indices.push_back(c);
				} else {
					++degeneratedFaces;
				}
			}
		} break;

		case '#': // comment
		default:
			break;
		} // end switch(bufPtr[0])
		// eat up rest of line
		bufPtr = goNextLine(bufPtr, bufEnd);
		++lineNr;
	} // end while(bufPtr && (bufPtr-buf<filesize))

	if (degeneratedFaces > 0) {
		irr::core::stringc log(degeneratedFaces);
		log += " degenerated faces removed in ";
		log += irr::core::stringc(fullName);
		os::Printer::log(log.c_str(), ELL_INFORMATION);
	}

	SMesh *mesh = new SMesh();

	// Combine all the groups (meshbuffers) into the mesh
	for (u32 m = 0; m < Materials.size(); ++m) {
		if (Materials[m]->Meshbuffer->getIndexCount() > 0) {
			Materials[m]->Meshbuffer->recalculateBoundingBox();
			if (Materials[m]->RecalculateNormals)
				SceneManager->getMeshManipulator()->recalculateNormals(Materials[m]->Meshbuffer);
			mesh->addMeshBuffer(Materials[m]->Meshbuffer);
		}
	}

	// Create the Animated mesh if there's anything in the mesh
	SAnimatedMesh *animMesh = 0;
	if (0 != mesh->getMeshBufferCount()) {
		mesh->recalculateBoundingBox();
		animMesh = new SAnimatedMesh();
		animMesh->Type = EAMT_OBJ;
		animMesh->addMesh(mesh);
		animMesh->recalculateBoundingBox();
	}

	// Clean up the allocate obj file contents
	delete[] buf;
	// more cleaning up
	cleanUp();
	mesh->drop();

	return animMesh;
}